

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v7::detail::
     handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>&>
               (char spec,
               int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 99) {
    if (iVar1 < 0x4c) {
      if (iVar1 == 0) {
LAB_0012d6f2:
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_dec(handler)
        ;
        return;
      }
      if (iVar1 == 0x42) {
LAB_0012d6e0:
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_bin(handler)
        ;
        return;
      }
    }
    else {
      if (iVar1 == 0x4c) {
LAB_0012d6fa:
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num(handler)
        ;
        return;
      }
      if (iVar1 == 0x58) {
LAB_0012d6cf:
        int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_hex(handler)
        ;
        return;
      }
      if (iVar1 == 0x62) goto LAB_0012d6e0;
    }
  }
  else if (iVar1 < 0x6e) {
    if (iVar1 == 99) {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_chr(handler);
      return;
    }
    if (iVar1 == 100) goto LAB_0012d6f2;
  }
  else {
    if (iVar1 == 0x6e) goto LAB_0012d6fa;
    if (iVar1 == 0x6f) {
      int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) goto LAB_0012d6cf;
  }
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}